

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObservation.cpp
# Opt level: O2

bool __thiscall test_CEObservation::test_cache(test_CEObservation *this)

{
  CEObservation *this_00;
  bool bVar1;
  undefined1 uVar2;
  double dVar3;
  double test_y;
  double test_x;
  CESkyCoord test2;
  CESkyCoord obs_coords;
  CEObservation test1;
  allocator local_181;
  undefined1 local_180 [16];
  double local_170;
  _func_int **local_168;
  double local_160;
  CEDate local_158;
  CEAngle local_118 [2];
  undefined4 local_f4;
  undefined1 local_f0 [96];
  CEObservation local_90;
  
  CEObservation::CEObservation(&local_90);
  local_f0._48_8_ = CEObservation::GetAltitude_Deg(&local_90);
  local_f0._0_8_ = (_func_int **)0x4056800000000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"test_cache",(allocator *)local_180);
  local_118[0]._vptr_CEAngle._0_4_ = 0x9f;
  (**(code **)(*(long *)this + 0x58))(this,local_f0 + 0x30,local_f0,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_180);
  local_f0._48_8_ = CEObservation::GetAzimuth_Deg(&local_90);
  local_f0._0_8_ = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"test_cache",(allocator *)local_180);
  local_118[0]._vptr_CEAngle._0_4_ = 0xa0;
  (**(code **)(*(long *)this + 0x58))(this,local_f0 + 0x30,local_f0,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_180);
  local_f0._48_8_ = CEObservation::GetZenith_Deg(&local_90);
  local_f0._0_8_ = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"test_cache",(allocator *)local_180);
  local_118[0]._vptr_CEAngle._0_4_ = 0xa1;
  (**(code **)(*(long *)this + 0x58))(this,local_f0 + 0x30,local_f0,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_180);
  local_f0._48_8_ = CEObservation::GetApparentXCoordinate_Deg(&local_90);
  local_f0._0_8_ = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"test_cache",(allocator *)local_180);
  local_118[0]._vptr_CEAngle._0_4_ = 0xa2;
  (**(code **)(*(long *)this + 0x58))(this,local_f0 + 0x30,local_f0,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_180);
  local_f0._48_8_ = CEObservation::GetApparentYCoordinate_Deg(&local_90);
  local_f0._0_8_ = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"test_cache",(allocator *)local_180);
  local_118[0]._vptr_CEAngle._0_4_ = 0xa3;
  (**(code **)(*(long *)this + 0x58))(this,local_f0 + 0x30,local_f0,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_180);
  local_f0._48_8_ = CEObservation::GetHourAngle_Deg(&local_90);
  local_f0._0_8_ = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"test_cache",(allocator *)local_180);
  local_118[0]._vptr_CEAngle = (_func_int **)CONCAT44(local_118[0]._vptr_CEAngle._4_4_,0xa4);
  (**(code **)(*(long *)this + 0x58))(this,local_f0 + 0x30,local_f0,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_180);
  local_118[0]._vptr_CEAngle = (_func_int **)0x4041c69b0fb3c61c;
  CEAngle::Deg((CEAngle *)&local_158,(double *)local_118);
  local_180._0_8_ = (_func_int **)0x4063122e3143ccb4;
  CEAngle::Deg((CEAngle *)local_f0,(double *)local_180);
  local_160 = (double)CONCAT44(local_160._4_4_,3);
  CESkyCoord::CESkyCoord
            ((CESkyCoord *)(local_f0 + 0x30),(CEAngle *)&local_158,(CEAngle *)local_f0,
             (CESkyCoordType *)&local_160);
  CEAngle::~CEAngle((CEAngle *)local_f0);
  CEAngle::~CEAngle((CEAngle *)&local_158);
  this_00 = &this->base_obs_;
  local_180._0_8_ = CEObservation::GetAzimuth_Rad(this_00);
  CEAngle::CEAngle((CEAngle *)&local_158,(double *)local_180);
  local_160 = CEObservation::GetZenith_Rad(this_00);
  CEAngle::CEAngle(local_118,&local_160);
  local_170 = (double)CONCAT44(local_170._4_4_,3);
  CESkyCoord::CESkyCoord
            ((CESkyCoord *)local_f0,(CEAngle *)&local_158,local_118,(CESkyCoordType *)&local_170);
  CEAngle::~CEAngle(local_118);
  CEAngle::~CEAngle((CEAngle *)&local_158);
  bVar1 = operator==((CESkyCoord *)(local_f0 + 0x30),(CESkyCoord *)local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"test_cache",(allocator *)local_180);
  local_118[0]._vptr_CEAngle = (_func_int **)CONCAT44(local_118[0]._vptr_CEAngle._4_4_,0xb0);
  (**(code **)(*(long *)this + 0x48))(this,bVar1,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_180);
  local_118[0]._vptr_CEAngle = (_func_int **)CEObservation::GetApparentXCoordinate_Deg(this_00);
  local_180._0_8_ = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"test_cache",(allocator *)&local_170);
  local_160._0_4_ = 0xb1;
  (**(code **)(*(long *)this + 0x58))(this,local_118,local_180,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_170);
  local_118[0]._vptr_CEAngle = (_func_int **)CEObservation::GetApparentYCoordinate_Deg(this_00);
  local_180._0_8_ = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"test_cache",(allocator *)&local_170);
  local_160._0_4_ = 0xb2;
  (**(code **)(*(long *)this + 0x58))(this,local_118,local_180,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_170);
  local_118[0]._vptr_CEAngle = (_func_int **)CEObservation::GetHourAngle_Deg(this_00);
  local_180._0_8_ = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"test_cache",(allocator *)&local_170);
  local_160 = (double)CONCAT44(local_160._4_4_,0xb3);
  (**(code **)(*(long *)this + 0x58))(this,local_118,local_180,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_170);
  local_160 = 0.0;
  local_170 = 0.0;
  CEObservation::GetAzimuthZenith_Deg(this_00,&local_160,&local_170);
  dVar3 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_158,dVar3,JD);
  CESkyCoord::XCoord((CESkyCoord *)local_180,(CEDate *)local_f0);
  local_168 = (_func_int **)CEAngle::Deg((CEAngle *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_118,"test_cache",&local_181);
  local_f4 = 0xba;
  (**(code **)(*(long *)this + 0x58))(this,&local_160,&local_168,local_118);
  std::__cxx11::string::~string((string *)local_118);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_181);
  CEAngle::~CEAngle((CEAngle *)local_180);
  CEDate::~CEDate(&local_158);
  dVar3 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_158,dVar3,JD);
  CESkyCoord::YCoord((CESkyCoord *)local_180,(CEDate *)local_f0);
  local_168 = (_func_int **)CEAngle::Deg((CEAngle *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_118,"test_cache",&local_181);
  local_f4 = 0xbb;
  (**(code **)(*(long *)this + 0x58))(this,&local_170,&local_168,local_118);
  std::__cxx11::string::~string((string *)local_118);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_181);
  CEAngle::~CEAngle((CEAngle *)local_180);
  CEDate::~CEDate(&local_158);
  CEObservation::GetApparentXYCoordinate_Deg(this_00,&local_160,&local_170);
  local_118[0]._vptr_CEAngle = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"test_cache",(allocator *)&local_168);
  local_180._0_4_ = 0xbf;
  (**(code **)(*(long *)this + 0x58))(this,&local_160,local_118,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_168);
  local_118[0]._vptr_CEAngle = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"test_cache",(allocator *)&local_168);
  local_180._0_4_ = 0xc0;
  (**(code **)(*(long *)this + 0x58))(this,&local_170,local_118,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_168);
  uVar2 = (**(code **)(*(long *)this + 0x18))(this);
  CESkyCoord::~CESkyCoord((CESkyCoord *)local_f0);
  CESkyCoord::~CESkyCoord((CESkyCoord *)(local_f0 + 0x30));
  CEObservation::~CEObservation(&local_90);
  return (bool)uVar2;
}

Assistant:

bool test_CEObservation::test_cache(void)
{
    // Test default values
    CEObservation test1;
    test_double(test1.GetAltitude_Deg(), 90.0, __func__, __LINE__);
    test_double(test1.GetAzimuth_Deg(), 0.0, __func__, __LINE__);
    test_double(test1.GetZenith_Deg(), 0.0, __func__, __LINE__);
    test_double(test1.GetApparentXCoordinate_Deg(), 0.0, __func__, __LINE__);
    test_double(test1.GetApparentYCoordinate_Deg(), 0.0, __func__, __LINE__);
    test_double(test1.GetHourAngle_Deg(), 0.0, __func__, __LINE__);
    
    // Now we setup the actual tests for observed coordinates
    // Note: these coordinates are derived from CESkyCoord tests
    CESkyCoord obs_coords(CEAngle::Deg(35.55160709646245), 
                          CEAngle::Deg(152.5681387256824),
                          CESkyCoordType::OBSERVED);
    CESkyCoord test2(base_obs_.GetAzimuth_Rad(),
                     base_obs_.GetZenith_Rad(),
                     CESkyCoordType::OBSERVED);

    // Test that the coordinates update when the date is changed
    test(obs_coords == test2, __func__, __LINE__);
    test_double(base_obs_.GetApparentXCoordinate_Deg(), 0.0, __func__, __LINE__);
    test_double(base_obs_.GetApparentYCoordinate_Deg(), 0.0, __func__, __LINE__);
    test_double(base_obs_.GetHourAngle_Deg(), 0.0, __func__, __LINE__);

    // Test the actual coordinates
    double test_x(0), test_y(0);
        
    // Test observed coordinates
    base_obs_.GetAzimuthZenith_Deg(&test_x, &test_y);
    test_double(test_x, test2.XCoord().Deg(), __func__, __LINE__);
    test_double(test_y, test2.YCoord().Deg(), __func__, __LINE__);

    // Test apparent coordinates
    base_obs_.GetApparentXYCoordinate_Deg(&test_x, &test_y);
    test_double(test_x, 0.0, __func__, __LINE__);
    test_double(test_y, 0.0, __func__, __LINE__);

    return pass();
}